

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_CustomModel_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CustomModel_CustomModelParamValue>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CustomModel_CustomModelParamValue> *)
             _CustomModel_CustomModelParamValue_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CustomModel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CustomModel> *)
             _CustomModel_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _CustomModel_CustomModelParamValue_default_instance_.Shutdown();
  _CustomModel_default_instance_.Shutdown();
}